

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O2

bool __thiscall irr::gui::CGUIListBox::OnEvent(CGUIListBox *this,SEvent *event)

{
  f32 *pfVar1;
  stringw *this_00;
  EEVENT_TYPE EVar2;
  EKEY_CODE EVar3;
  EGUI_EVENT_TYPE EVar4;
  uint uVar5;
  IGUIScrollBar *pIVar6;
  pointer pLVar7;
  char cVar8;
  undefined1 uVar9;
  bool bVar10;
  int iVar11;
  u32 uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  s32 ypos;
  long *plVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  SEvent e;
  
  cVar8 = (**(code **)(*(long *)this + 0x90))();
  if (cVar8 == '\0') goto switchD_00232c85_caseD_1;
  EVar2 = event->EventType;
  if (EVar2 == EET_GUI_EVENT) {
    EVar4 = (event->field_1).GUIEvent.EventType;
    if (EVar4 == EGET_ELEMENT_FOCUS_LOST) {
      if ((CGUIListBox *)(event->field_1).GUIEvent.Caller == this) {
        this->Selecting = false;
      }
    }
    else if ((EVar4 == EGET_SCROLL_BAR_CHANGED) &&
            ((event->field_1).GUIEvent.Caller == &this->ScrollBar->super_IGUIElement)) {
      return (bool)1;
    }
    goto switchD_00232c85_caseD_1;
  }
  if (EVar2 == EET_MOUSE_INPUT_EVENT) {
    e._0_8_ = *(undefined8 *)&event->field_1;
    switch((event->field_1).MouseInput.Event) {
    case EMIE_LMOUSE_PRESSED_DOWN:
      this->Selecting = true;
      return (bool)1;
    case EMIE_LMOUSE_LEFT_UP:
      this->Selecting = false;
      cVar8 = (**(code **)(*(long *)this + 0x28))(this,&e);
      if (cVar8 == '\0') {
        return (bool)1;
      }
      ypos = (event->field_1).MouseInput.Y;
      bVar10 = false;
LAB_00232d74:
      selectNew(this,ypos,bVar10);
      return true;
    case EMIE_MOUSE_MOVED:
      if (((this->Selecting != false) || (this->MoveOverSelect == true)) &&
         (cVar8 = (**(code **)(*(long *)this + 0x28))(this,&e), cVar8 != '\0')) {
        ypos = (event->field_1).MouseInput.Y;
        bVar10 = true;
        goto LAB_00232d74;
      }
      break;
    case EMIE_MOUSE_WHEEL:
      pIVar6 = this->ScrollBar;
      iVar11 = (*(pIVar6->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2c])
                         (pIVar6);
      pfVar1 = &(event->field_1).MouseInput.Wheel;
      iVar14 = -this->ItemHeight;
      if ((float)*pfVar1 <= 0.0 && (float)*pfVar1 != 0.0) {
        iVar14 = this->ItemHeight;
      }
      (*(pIVar6->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2d])
                (pIVar6,(ulong)(uint)(iVar11 + iVar14 / 2),(long)iVar14 % 2 & 0xffffffff);
      return (bool)1;
    }
    goto switchD_00232c85_caseD_1;
  }
  if (EVar2 != EET_KEY_INPUT_EVENT) goto switchD_00232c85_caseD_1;
  EVar3 = (event->field_1).KeyInput.Key;
  if (((event->field_1).field13[0xc] & 1) == 0) {
    if (EVar3 == KEY_TAB) {
      return (bool)0;
    }
    if ((EVar3 == KEY_SPACE) || (EVar3 == KEY_RETURN)) {
      plVar16 = *(long **)&this->field_0x20;
      if (plVar16 == (long *)0x0) {
        return (bool)1;
      }
      e.field_1.GUIEvent.EventType = EGET_LISTBOX_SELECTED_AGAIN;
      goto LAB_00232cf9;
    }
LAB_00232dcd:
    if ((((event->field_1).field13[0xc] & 1) != 0) && ((event->field_1).MouseInput.X != 0)) {
      uVar12 = os::Timer::getTime();
      this_00 = &this->KeyBuffer;
      if (uVar12 - this->LastKeyTime < 500) {
        if (((int)(this->KeyBuffer).str._M_string_length != 1) ||
           (*(this_00->str)._M_dataplus._M_p != (event->field_1).MouseInput.X)) {
          core::string<wchar_t>::operator+=(this_00,L" ");
          (this->KeyBuffer).str._M_dataplus._M_p[(int)(this->KeyBuffer).str._M_string_length - 1] =
               (event->field_1).MouseInput.X;
        }
      }
      else {
        core::string<wchar_t>::operator=(this_00,L" ");
        *(this_00->str)._M_dataplus._M_p = (event->field_1).MouseInput.X;
      }
      this->LastKeyTime = uVar12;
      uVar15 = this->Selected;
      lVar17 = (long)(int)uVar15;
      if (((-1 < lVar17) && (uVar5 = (uint)(this->KeyBuffer).str._M_string_length, 1 < uVar5)) &&
         (pLVar7 = (this->Items).m_data.
                   super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         uVar5 <= (uint)pLVar7[lVar17].Text.str._M_string_length)) {
        core::string<wchar_t>::subString((string<wchar_t> *)&e,&pLVar7[lVar17].Text,0,uVar5,false);
        bVar10 = core::string<wchar_t>::equals_ignore_case(this_00,(string<wchar_t> *)&e);
        ::std::__cxx11::wstring::_M_dispose();
        if (bVar10) {
          return (bool)1;
        }
      }
      do {
        do {
          uVar15 = uVar15 + 1;
          pLVar7 = (this->Items).m_data.
                   super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((int)(((long)(this->Items).m_data.
                           super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar7) / 0x48) <=
              (int)uVar15) {
            lVar18 = 0;
            uVar19 = 0;
            do {
              if (lVar17 < (long)uVar19) {
                return (bool)1;
              }
              pLVar7 = (this->Items).m_data.
                       super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar15 = (uint)(this->KeyBuffer).str._M_string_length;
              if (uVar15 <= *(uint *)((long)(pLVar7->OverrideColors + -4) + lVar18 + 4)) {
                core::string<wchar_t>::subString
                          ((string<wchar_t> *)&e,
                           (string<wchar_t> *)((long)pLVar7->OverrideColors + lVar18 + -0x24),0,
                           uVar15,false);
                bVar10 = core::string<wchar_t>::equals_ignore_case(this_00,(string<wchar_t> *)&e);
                ::std::__cxx11::wstring::_M_dispose();
                if (bVar10) {
                  if (((*(long **)&this->field_0x20 != (long *)0x0) &&
                      (this->Selected != (int)uVar19)) &&
                     ((this->Selecting == false && (this->MoveOverSelect == false)))) {
                    this->Selected = (int)uVar19;
                    e._0_8_ = e._0_8_ & 0xffffffff00000000;
                    e.field_1.GUIEvent.Element = (IGUIElement *)0x0;
                    e.field_1.GUIEvent.EventType = EGET_LISTBOX_CHANGED;
                    e.field_1.GUIEvent.Caller = (IGUIElement *)this;
                    (**(code **)(**(long **)&this->field_0x20 + 0x10))();
                  }
                  (**(code **)(*(long *)this + 0x170))(this,uVar19 & 0xffffffff);
                  return (bool)1;
                }
              }
              uVar19 = uVar19 + 1;
              lVar18 = lVar18 + 0x48;
            } while( true );
          }
          uVar5 = (uint)(this->KeyBuffer).str._M_string_length;
        } while ((uint)pLVar7[uVar15].Text.str._M_string_length < uVar5);
        core::string<wchar_t>::subString((string<wchar_t> *)&e,&pLVar7[uVar15].Text,0,uVar5,false);
        bVar10 = core::string<wchar_t>::equals_ignore_case(this_00,(string<wchar_t> *)&e);
        ::std::__cxx11::wstring::_M_dispose();
      } while (!bVar10);
      if (((*(long **)&this->field_0x20 != (long *)0x0) && (this->Selected != uVar15)) &&
         ((this->Selecting == false && (this->MoveOverSelect == false)))) {
        e._0_8_ = e._0_8_ & 0xffffffff00000000;
        e.field_1.GUIEvent.Element = (IGUIElement *)0x0;
        e.field_1.GUIEvent.EventType = EGET_LISTBOX_CHANGED;
        e.field_1.GUIEvent.Caller = (IGUIElement *)this;
        (**(code **)(**(long **)&this->field_0x20 + 0x10))();
      }
      (**(code **)(*(long *)this + 0x170))(this,uVar15);
      return (bool)1;
    }
switchD_00232c85_caseD_1:
    plVar16 = *(long **)&this->field_0x20;
    if (plVar16 != (long *)0x0) {
      uVar9 = (**(code **)(*plVar16 + 0x10))(plVar16,event);
      return (bool)uVar9;
    }
    return (bool)0;
  }
  if (KEY_DOWN < EVar3) goto LAB_00232dcd;
  if ((0x15e00000000U >> ((ulong)EVar3 & 0x3f) & 1) == 0) {
    if ((ulong)EVar3 == 9) {
      return (bool)0;
    }
    goto LAB_00232dcd;
  }
  iVar11 = this->Selected;
  iVar14 = iVar11;
  switch(EVar3) {
  case KEY_PRIOR:
    iVar14 = iVar11 - (*(int *)&this->field_0x4c - *(int *)&this->field_0x44) / this->ItemHeight;
    break;
  case KEY_NEXT:
    iVar14 = (*(int *)&this->field_0x4c - *(int *)&this->field_0x44) / this->ItemHeight + iVar11;
    break;
  case KEY_END:
    iVar14 = (int)(((long)(this->Items).m_data.
                          super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->Items).m_data.
                         super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x48) + -1;
    break;
  case KEY_HOME:
    goto switchD_00232c47_caseD_24;
  default:
    goto switchD_00232c47_caseD_25;
  case KEY_UP:
    iVar14 = iVar11 + -1;
    break;
  case KEY_DOWN:
    iVar14 = iVar11 + 1;
  }
  this->Selected = iVar14;
switchD_00232c47_caseD_25:
  if (iVar14 < 0) {
switchD_00232c47_caseD_24:
    this->Selected = 0;
    iVar14 = 0;
  }
  iVar13 = (int)(((long)(this->Items).m_data.
                        super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->Items).m_data.
                       super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x48);
  if (iVar13 <= iVar14) {
    this->Selected = iVar13 + -1;
  }
  recalculateScrollPos(this);
  if (iVar11 == this->Selected) {
    return (bool)1;
  }
  plVar16 = *(long **)&this->field_0x20;
  if (plVar16 == (long *)0x0) {
    return (bool)1;
  }
  if (this->Selecting != false) {
    return (bool)1;
  }
  if (this->MoveOverSelect != false) {
    return (bool)1;
  }
  e.field_1.GUIEvent.EventType = EGET_LISTBOX_CHANGED;
LAB_00232cf9:
  e._0_8_ = e._0_8_ & 0xffffffff00000000;
  e.field_1.GUIEvent.Element = (IGUIElement *)0x0;
  e.field_1.GUIEvent.Caller = (IGUIElement *)this;
  (**(code **)(*plVar16 + 0x10))();
  return (bool)1;
}

Assistant:

bool CGUIListBox::OnEvent(const SEvent &event)
{
	if (isEnabled()) {
		switch (event.EventType) {
		case EET_KEY_INPUT_EVENT:
			if (event.KeyInput.PressedDown &&
					(event.KeyInput.Key == KEY_DOWN ||
							event.KeyInput.Key == KEY_UP ||
							event.KeyInput.Key == KEY_HOME ||
							event.KeyInput.Key == KEY_END ||
							event.KeyInput.Key == KEY_NEXT ||
							event.KeyInput.Key == KEY_PRIOR)) {
				s32 oldSelected = Selected;
				switch (event.KeyInput.Key) {
				case KEY_DOWN:
					Selected += 1;
					break;
				case KEY_UP:
					Selected -= 1;
					break;
				case KEY_HOME:
					Selected = 0;
					break;
				case KEY_END:
					Selected = (s32)Items.size() - 1;
					break;
				case KEY_NEXT:
					Selected += AbsoluteRect.getHeight() / ItemHeight;
					break;
				case KEY_PRIOR:
					Selected -= AbsoluteRect.getHeight() / ItemHeight;
					break;
				default:
					break;
				}
				if (Selected < 0)
					Selected = 0;
				if (Selected >= (s32)Items.size())
					Selected = Items.size() - 1; // will set Selected to -1 for empty listboxes which is correct

				recalculateScrollPos();

				// post the news

				if (oldSelected != Selected && Parent && !Selecting && !MoveOverSelect) {
					SEvent e;
					e.EventType = EET_GUI_EVENT;
					e.GUIEvent.Caller = this;
					e.GUIEvent.Element = 0;
					e.GUIEvent.EventType = EGET_LISTBOX_CHANGED;
					Parent->OnEvent(e);
				}

				return true;
			} else if (!event.KeyInput.PressedDown && (event.KeyInput.Key == KEY_RETURN || event.KeyInput.Key == KEY_SPACE)) {
				if (Parent) {
					SEvent e;
					e.EventType = EET_GUI_EVENT;
					e.GUIEvent.Caller = this;
					e.GUIEvent.Element = 0;
					e.GUIEvent.EventType = EGET_LISTBOX_SELECTED_AGAIN;
					Parent->OnEvent(e);
				}
				return true;
			} else if (event.KeyInput.Key == KEY_TAB) {
				return false;
			} else if (event.KeyInput.PressedDown && event.KeyInput.Char) {
				// change selection based on text as it is typed.
				u32 now = os::Timer::getTime();

				if (now - LastKeyTime < 500) {
					// add to key buffer if it isn't a key repeat
					if (!(KeyBuffer.size() == 1 && KeyBuffer[0] == event.KeyInput.Char)) {
						KeyBuffer += L" ";
						KeyBuffer[KeyBuffer.size() - 1] = event.KeyInput.Char;
					}
				} else {
					KeyBuffer = L" ";
					KeyBuffer[0] = event.KeyInput.Char;
				}
				LastKeyTime = now;

				// find the selected item, starting at the current selection
				s32 start = Selected;
				// dont change selection if the key buffer matches the current item
				if (Selected > -1 && KeyBuffer.size() > 1) {
					if (Items[Selected].Text.size() >= KeyBuffer.size() &&
							KeyBuffer.equals_ignore_case(Items[Selected].Text.subString(0, KeyBuffer.size())))
						return true;
				}

				s32 current;
				for (current = start + 1; current < (s32)Items.size(); ++current) {
					if (Items[current].Text.size() >= KeyBuffer.size()) {
						if (KeyBuffer.equals_ignore_case(Items[current].Text.subString(0, KeyBuffer.size()))) {
							if (Parent && Selected != current && !Selecting && !MoveOverSelect) {
								SEvent e;
								e.EventType = EET_GUI_EVENT;
								e.GUIEvent.Caller = this;
								e.GUIEvent.Element = 0;
								e.GUIEvent.EventType = EGET_LISTBOX_CHANGED;
								Parent->OnEvent(e);
							}
							setSelected(current);
							return true;
						}
					}
				}
				for (current = 0; current <= start; ++current) {
					if (Items[current].Text.size() >= KeyBuffer.size()) {
						if (KeyBuffer.equals_ignore_case(Items[current].Text.subString(0, KeyBuffer.size()))) {
							if (Parent && Selected != current && !Selecting && !MoveOverSelect) {
								Selected = current;
								SEvent e;
								e.EventType = EET_GUI_EVENT;
								e.GUIEvent.Caller = this;
								e.GUIEvent.Element = 0;
								e.GUIEvent.EventType = EGET_LISTBOX_CHANGED;
								Parent->OnEvent(e);
							}
							setSelected(current);
							return true;
						}
					}
				}

				return true;
			}
			break;

		case EET_GUI_EVENT:
			switch (event.GUIEvent.EventType) {
			case gui::EGET_SCROLL_BAR_CHANGED:
				if (event.GUIEvent.Caller == ScrollBar)
					return true;
				break;
			case gui::EGET_ELEMENT_FOCUS_LOST: {
				if (event.GUIEvent.Caller == this)
					Selecting = false;
			}
			default:
				break;
			}
			break;

		case EET_MOUSE_INPUT_EVENT: {
			core::position2d<s32> p(event.MouseInput.X, event.MouseInput.Y);

			switch (event.MouseInput.Event) {
			case EMIE_MOUSE_WHEEL:
				ScrollBar->setPos(ScrollBar->getPos() + (event.MouseInput.Wheel < 0 ? -1 : 1) * -ItemHeight / 2);
				return true;

			case EMIE_LMOUSE_PRESSED_DOWN: {
				Selecting = true;
				return true;
			}

			case EMIE_LMOUSE_LEFT_UP: {
				Selecting = false;

				if (isPointInside(p))
					selectNew(event.MouseInput.Y);

				return true;
			}

			case EMIE_MOUSE_MOVED:
				if (Selecting || MoveOverSelect) {
					if (isPointInside(p)) {
						selectNew(event.MouseInput.Y, true);
						return true;
					}
				}
			default:
				break;
			}
		} break;
		default:
			break;
		}
	}

	return IGUIElement::OnEvent(event);
}